

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-parser.h
# Opt level: O2

int ORPG::Core::getopt_internal(int argc,char **argv,char *options)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  int opt_end;
  uint __c;
  
  iVar2 = optreset;
  while( true ) {
    opt_end = optind;
    if (iVar2 == 0) {
      cVar5 = *getopt_internal::place;
      if (cVar5 != '\0') goto LAB_001024e9;
    }
    else {
      nonopt_end = -1;
      nonopt_start = -1;
    }
    optreset = 0;
    if (argc <= optind) {
      getopt_internal::place = "";
      if (nonopt_end == -1) {
        if (nonopt_start == -1) goto LAB_001024ab;
      }
      else {
        permute_args(nonopt_start,nonopt_end,optind,argv);
        nonopt_start = (nonopt_start - nonopt_end) + optind;
      }
      optind = nonopt_start;
      goto LAB_001024ab;
    }
    pcVar4 = argv[optind];
    if ((*pcVar4 == '-') &&
       ((cVar5 = pcVar4[1], cVar5 != '\0' || (pcVar3 = strchr(options,0x2d), pcVar3 != (char *)0x0))
       )) break;
    getopt_internal::place = "";
    if (nonopt_start == -1) {
      nonopt_start = opt_end;
LAB_001023cd:
      iVar2 = 0;
    }
    else {
      if (nonopt_end == -1) goto LAB_001023cd;
      permute_args(nonopt_start,nonopt_end,opt_end,argv);
      nonopt_start = nonopt_start + (optind - nonopt_end);
      nonopt_end = -1;
      iVar2 = optreset;
      opt_end = optind;
    }
    optind = opt_end + 1;
  }
  if (nonopt_end == -1 && nonopt_start != -1) {
    nonopt_end = opt_end;
  }
  getopt_internal::place = pcVar4;
  if (((cVar5 == '\0') || (getopt_internal::place = pcVar4 + 1, cVar5 != '-')) ||
     (pcVar4[2] != '\0')) {
    if (getopt_internal::place[1] != '\0') {
      if (*getopt_internal::place == '-') {
        getopt_internal::place = "";
        return -2;
      }
      getopt_internal::place = getopt_internal::place + 1;
    }
    cVar5 = *getopt_internal::place;
LAB_001024e9:
    pcVar4 = getopt_internal::place + 1;
    __c = (uint)cVar5;
    getopt_internal::place = pcVar4;
    optopt = __c;
    if (cVar5 != ':') {
      pcVar3 = strchr(options,__c);
      pFVar1 = _stderr;
      if (pcVar3 != (char *)0x0) {
        if (pcVar3[1] != ':') {
          if (*pcVar4 != '\0') {
            optarg = (char *)0x0;
            return __c;
          }
          optind = optind + 1;
          optarg = (char *)0x0;
          return __c;
        }
        if (*pcVar4 == '\0') {
          iVar2 = optind + 1;
          if (argc <= iVar2) {
            getopt_internal::place = "";
            if (opterr == 0) {
              optind = iVar2;
              return 0x3a;
            }
            if (*options == ':') {
              optind = iVar2;
              return 0x3a;
            }
            optind = iVar2;
            pcVar4 = program_name(*argv);
            fprintf(pFVar1,"%s: option requires an argument -- %c\n",pcVar4,(ulong)__c);
            return 0x3a;
          }
          pcVar4 = argv[(long)optind + 1];
          optind = iVar2;
        }
        getopt_internal::place = "";
        optind = optind + 1;
        optarg = pcVar4;
        return __c;
      }
      if (cVar5 == '-') goto LAB_001024b9;
    }
    pFVar1 = _stderr;
    if (*pcVar4 == '\0') {
      optind = optind + 1;
    }
    iVar2 = 0x3f;
    if ((opterr != 0) && (*options != ':')) {
      pcVar3 = program_name(*argv);
      fprintf(pFVar1,"%s: illegal option -- %c%s\n",pcVar3,(ulong)__c,pcVar4);
    }
  }
  else {
    optind = opt_end + 1;
    getopt_internal::place = "";
    if (nonopt_end != -1) {
      permute_args(nonopt_start,nonopt_end,optind,argv);
      optind = optind + (nonopt_start - nonopt_end);
    }
LAB_001024ab:
    nonopt_end = -1;
    nonopt_start = -1;
LAB_001024b9:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int getopt_internal(int argc,
                            char* argv[],
                            const char *options) {
            /* option letter processing */
            static char* place = EMPTY;

            /* option letter list index */
            char* olli;

            /* reset our non-option start and end positions */
            if (optreset)
                nonopt_start = nonopt_end = -1;

            /* update scanning pointer */
            if (optreset || !*place) {
                optreset = 0;

                /* end of argument array */
                if (optind >= argc) {
                    place = EMPTY;

                    if (nonopt_end != -1) {
                        /* do permutation, if we have to
                        TODO: get this working!! */
                        permute_args(nonopt_start, nonopt_end, optind, argv);

                        optind -= nonopt_end - nonopt_start;
                    } else if (nonopt_start != -1) {
                        /* If we skipped non-options, set optind
                        to the first of them. */
                        optind = nonopt_start;
                    }

                    nonopt_start = nonopt_end = -1;

                    return EOF;
                }

                /* check if this is a non-option */
                if(*(place = argv[optind]) != OP_DELIM ||
                (place[1] == '\0' && strchr(options, '-') == NULL)) {
                    place = EMPTY;

                    /* if we found the first non-argument set, then start there
                    otherwise if we found the last non-argument then do a
                    permutation

                    TODO: Get this working!!! */
                    if (nonopt_start == -1)
                        nonopt_start = optind;
                    else if (nonopt_end != -1) {
                        permute_args(nonopt_start, nonopt_end, optind, argv);

                        nonopt_start = optind - (nonopt_end - nonopt_start);
                        nonopt_end = -1;
                    }

                    optind++;

                    return getopt_internal(argc, argv, options);
                }

                if (nonopt_start != -1 && nonopt_end == -1)
                    nonopt_end = optind;

                /* If we have "-" do nothing, if "--" we are done */
                if (place[1] != '\0' && *++place == '-' && place[1] == '\0') {
                    optind++;
                    place = EMPTY;
                    /* We found a long option (--), so if we skipped
                    non-options, we have to permute. */
                    if (nonopt_end != -1) {
                        permute_args(nonopt_start, nonopt_end, optind, argv);
                        optind -= nonopt_end - nonopt_start;
                    }

                    nonopt_start = nonopt_end = -1;

                    return -1;
                }

                /* found "--" */
                if (place[1] && *place++ == OP_DELIM) {
                    /* ++optind; */
                    place = EMPTY;

                    return CONTINUE_CODE;
                }
            }

            /* option letter okay? */
            if ((optopt = (int)*place++) == BADARG ||
                !(olli = (char *)strchr(options, optopt))) {
                /*
                * if the user didn't specify OP_DELIM as an option,
                * assume it means EOF.
                */
                if (optopt == (int)OP_DELIM)
                    return EOF;
                if (!*place)
                    ++optind;
                if (opterr && *options != ':')
                    (void)fprintf(stderr,
                                "%s: illegal option -- %c%s\n",
                                program_name(argv[0]), optopt, place);

                return BADCHAR;
            }
            if (*++olli != ':') {
                /* don't need argument */
                optarg = NULL;
                if (!*place)
                    ++optind;
            } else {
                /* need an argument */

                /* no white space */
                if (*place)
                    optarg = place;
                /* no arg */
                else if (argc <= ++optind) {
                    place = EMPTY;
                    if ((opterr) && (*options != ':'))
                        (void)fprintf(stderr,
                                    "%s: option requires an argument -- %c\n",
                                    program_name(argv[0]), optopt);
                    return BADARG;
                } else
                    /* white space */
                    optarg = argv[optind];

                place = EMPTY;
                ++optind;
            }

            /* dump back option letter */
            return optopt;
        }